

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

ON_MeshCacheItem * __thiscall
ON_MeshCache::Internal_CopyItem(ON_MeshCache *this,ON_MeshCacheItem *src_item)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 uVar2;
  unsigned_short uVar3;
  unsigned_short uVar4;
  ON_MeshCacheItem *pOVar5;
  
  pOVar5 = (ON_MeshCacheItem *)onmalloc(0x28);
  uVar3 = (src_item->m_mesh_id).Data2;
  uVar4 = (src_item->m_mesh_id).Data3;
  uVar2 = *(undefined8 *)(src_item->m_mesh_id).Data4;
  (pOVar5->m_mesh_id).Data1 = (src_item->m_mesh_id).Data1;
  (pOVar5->m_mesh_id).Data2 = uVar3;
  (pOVar5->m_mesh_id).Data3 = uVar4;
  *(undefined8 *)(pOVar5->m_mesh_id).Data4 = uVar2;
  (pOVar5->m_mesh_sp).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (src_item->m_mesh_sp).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (src_item->m_mesh_sp).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  (pOVar5->m_mesh_sp).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  pOVar5->m_next = (ON_MeshCacheItem *)0x0;
  return pOVar5;
}

Assistant:

class ON_MeshCacheItem* ON_MeshCache::Internal_CopyItem(const class ON_MeshCacheItem& src_item)
{
  // Items must come from the main memory pool to prevent
  // crashing when meshing operations are canceled.
  // Use placement operator new with main heap memory.
  ON_MeshCacheItem* item;
  void* p = onmalloc(sizeof(*item));
  item = new (p) ON_MeshCacheItem(src_item);
  item->m_next = nullptr;
  return item;
}